

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

bool QPDF::validatePDFVersion(char **p,string *version)

{
  char *pcVar1;
  char cVar2;
  
  pcVar1 = *p;
  cVar2 = *pcVar1;
  if ((byte)(cVar2 - 0x30U) < 10) {
    while ((byte)(cVar2 - 0x30U) < 10) {
      *p = pcVar1 + 1;
      std::__cxx11::string::append((ulong)version,'\x01');
      pcVar1 = *p;
      cVar2 = *pcVar1;
    }
    if ((cVar2 == '.') && ((byte)(pcVar1[1] - 0x30U) < 10)) {
      do {
        *p = pcVar1 + 1;
        std::__cxx11::string::append((ulong)version,'\x01');
        pcVar1 = *p;
      } while ((byte)(*pcVar1 - 0x30U) < 10);
      return true;
    }
  }
  return false;
}

Assistant:

bool
QPDF::validatePDFVersion(char const*& p, std::string& version)
{
    bool valid = util::is_digit(*p);
    if (valid) {
        while (util::is_digit(*p)) {
            version.append(1, *p++);
        }
        if ((*p == '.') && util::is_digit(*(p + 1))) {
            version.append(1, *p++);
            while (util::is_digit(*p)) {
                version.append(1, *p++);
            }
        } else {
            valid = false;
        }
    }
    return valid;
}